

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.c
# Opt level: O2

uint64_t readUint64InLittleEndian(void *memory)

{
  return *memory;
}

Assistant:

uint64_t readUint64InLittleEndian(void* memory)
{
	uint8_t* p = memory;
	return (((uint64_t)p[7]) << 56) | 
		   (((uint64_t)p[6]) << 48) |
		   (((uint64_t)p[5]) << 40) |
		   (((uint64_t)p[4]) << 32) |
		   (((uint64_t)p[3]) << 24) | 
		   (((uint64_t)p[2]) << 16) |
		   (((uint64_t)p[1]) <<  8) |
		   (((uint64_t)p[0]));
}